

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,StringRef error)

{
  StringRef name;
  ScopedElement local_58;
  pointer local_48 [2];
  _Alloc_hider local_38;
  
  local_48[0] = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"failed","");
  XmlWriter::scopedElement
            ((XmlWriter *)&local_58,(string *)&this->m_xml,(XmlFormatting)(string *)local_48);
  name.m_size = 7;
  name.m_start = "message";
  XmlWriter::writeAttribute(local_58.m_writer,name,error);
  XmlWriter::ScopedElement::~ScopedElement(&local_58);
  if (local_48[0] != (pointer)&local_38) {
    operator_delete(local_48[0],(ulong)(local_38._M_p + 1));
  }
  XmlWriter::endElement(&this->m_xml,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(StringRef error) {
        m_xml.scopedElement("failed").
            writeAttribute("message"_sr, error);
        m_xml.endElement();
    }